

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::GetCV(ON_NurbsSurface *this,int i,int j,ON_4dPoint *point)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  
  bVar2 = false;
  bVar5 = false;
  if (-1 < (j | i)) {
    uVar1 = this->m_dim;
    bVar5 = bVar2;
    if (((0 < (int)uVar1) && (i < this->m_cv_count[0])) && (j < this->m_cv_count[1])) {
      uVar3 = j * this->m_cv_stride[1] + i * this->m_cv_stride[0];
      pdVar4 = (double *)0x0;
      if (-1 < (int)uVar3) {
        pdVar4 = this->m_cv + uVar3;
      }
      if (this->m_cv == (double *)0x0) {
        pdVar4 = (double *)0x0;
      }
      bVar5 = pdVar4 != (double *)0x0;
      if (bVar5) {
        point->x = *pdVar4;
        dVar6 = 0.0;
        dVar7 = 0.0;
        if (1 < (int)uVar1) {
          dVar7 = pdVar4[1];
        }
        point->y = dVar7;
        if (2 < (int)uVar1) {
          dVar6 = pdVar4[2];
        }
        point->z = dVar6;
        if (this->m_is_rat == 0) {
          dVar7 = 1.0;
        }
        else {
          dVar7 = pdVar4[uVar1];
        }
        point->w = dVar7;
        bVar5 = true;
      }
    }
  }
  return bVar5;
}

Assistant:

bool 
ON_NurbsSurface::GetCV( int i, int j, ON_4dPoint& point ) const
{
  bool rc = false;
  if (m_dim > 0 && i >= 0 && j >= 0 && i < m_cv_count[0] && j < m_cv_count[1])
  {
    const double* cv = CV(i, j);
    if (cv) {
      point.x = cv[0];
      point.y = (m_dim > 1) ? cv[1] : 0.0;
      point.z = (m_dim > 2) ? cv[2] : 0.0;
      point.w = (m_is_rat) ? cv[m_dim] : 1.0;
      rc = true;
    }
  }
  return rc;
}